

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O1

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::prepare
          (RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *this)

{
  uint uVar1;
  FuncNode *pFVar2;
  BaseRAPass *pBVar3;
  Error EVar4;
  RABlock *pRVar5;
  BaseNode *node;
  
  pFVar2 = this->_pass->_func;
  node = (BaseNode *)0x0;
  this->_funcNode = pFVar2;
  pRVar5 = BaseRAPass::newBlockOrExistingAt(this->_pass,pFVar2->_exitNode,&node);
  this->_retBlock = pRVar5;
  EVar4 = 1;
  if (pRVar5 != (RABlock *)0x0) {
    uVar1 = *(uint *)(pRVar5 + 0xc);
    *(uint *)(pRVar5 + 0xc) = uVar1 | 4;
    pBVar3 = this->_pass;
    *(uint *)(pRVar5 + 0xc) = uVar1 | 0x14;
    if ((*(int *)&pBVar3->field_0xc8 != *(int *)&pBVar3->field_0xcc) ||
       (EVar4 = ZoneVectorBase::_grow((ZoneVectorBase *)&pBVar3->_exits,&pBVar3->_allocator,8,1),
       EVar4 == 0)) {
      *(RABlock **)(*(long *)&pBVar3->_exits + (ulong)*(uint *)&pBVar3->field_0xc8 * 8) = pRVar5;
      *(int *)&pBVar3->field_0xc8 = *(int *)&pBVar3->field_0xc8 + 1;
      EVar4 = 0;
    }
    if (EVar4 == 0) {
      if ((FuncNode *)node == pFVar2) {
        this->_curBlock = this->_retBlock;
      }
      else {
        pRVar5 = BaseRAPass::newBlock(this->_pass,(BaseNode *)0x0);
        this->_curBlock = pRVar5;
        if (pRVar5 == (RABlock *)0x0) {
          return 1;
        }
      }
      (this->_blockRegStats)._packed = 0;
      this->_exitLabelId = *(uint32_t *)(pFVar2->_exitNode + 0x30);
      this->_hasCode = false;
      EVar4 = BaseRAPass::addBlock(this->_pass,this->_curBlock);
    }
  }
  return EVar4;
}

Assistant:

Error prepare() noexcept {
    FuncNode* func = _pass->func();
    BaseNode* node = nullptr;

    // Create entry and exit blocks.
    _funcNode = func;
    _retBlock = _pass->newBlockOrExistingAt(func->exitNode(), &node);

    if (ASMJIT_UNLIKELY(!_retBlock))
      return DebugUtils::errored(kErrorOutOfMemory);

    _retBlock->makeTargetable();
    ASMJIT_PROPAGATE(_pass->addExitBlock(_retBlock));

    if (node != func) {
      _curBlock = _pass->newBlock();
      if (ASMJIT_UNLIKELY(!_curBlock))
        return DebugUtils::errored(kErrorOutOfMemory);
    }
    else {
      // Function that has no code at all.
      _curBlock = _retBlock;
    }

    // Reset everything we may need.
    _blockRegStats.reset();
    _exitLabelId = func->exitNode()->labelId();

    // Initially we assume there is no code in the function body.
    _hasCode = false;

    return _pass->addBlock(_curBlock);
  }